

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::AppendLinkDepends
          (cmMakefileTargetGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,string *linkLanguage)

{
  cmGeneratorTarget *pcVar1;
  ModuleDefinitionInfo *pMVar2;
  string *psVar3;
  pointer ppcVar4;
  pointer ppcVar5;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> manifest_srcs;
  string sStack_68;
  _Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_48;
  
  AppendObjectDepends(this,depends);
  AppendTargetDepends(this,depends,false);
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_(&sStack_68,this);
  pMVar2 = cmGeneratorTarget::GetModuleDefinitionInfo(pcVar1,&sStack_68);
  std::__cxx11::string::~string((string *)&sStack_68);
  if (pMVar2 != (ModuleDefinitionInfo *)0x0) {
    ppcVar4 = (pMVar2->Sources).
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppcVar5 = (pMVar2->Sources).
                   super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppcVar5 != ppcVar4;
        ppcVar5 = ppcVar5 + 1) {
      psVar3 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar5);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(depends,psVar3);
    }
  }
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_(&sStack_68,this);
  cmGeneratorTarget::GetManifests
            (pcVar1,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&local_48
             ,&sStack_68);
  std::__cxx11::string::~string((string *)&sStack_68);
  ppcVar5 = local_48._M_impl.super__Vector_impl_data._M_finish;
  for (ppcVar4 = local_48._M_impl.super__Vector_impl_data._M_start; ppcVar4 != ppcVar5;
      ppcVar4 = ppcVar4 + 1) {
    psVar3 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar4);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(depends,psVar3);
  }
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_(&sStack_68,this);
  cmGeneratorTarget::GetLinkDepends(pcVar1,depends,&sStack_68,linkLanguage);
  std::__cxx11::string::~string((string *)&sStack_68);
  std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
            (&local_48);
  return;
}

Assistant:

void cmMakefileTargetGenerator::AppendLinkDepends(
  std::vector<std::string>& depends, const std::string& linkLanguage)
{
  this->AppendObjectDepends(depends);

  // Add dependencies on targets that must be built first.
  this->AppendTargetDepends(depends);

  // Add a dependency on the link definitions file, if any.
  if (cmGeneratorTarget::ModuleDefinitionInfo const* mdi =
        this->GeneratorTarget->GetModuleDefinitionInfo(
          this->GetConfigName())) {
    for (cmSourceFile const* src : mdi->Sources) {
      depends.push_back(src->GetFullPath());
    }
  }

  // Add a dependency on user-specified manifest files, if any.
  std::vector<cmSourceFile const*> manifest_srcs;
  this->GeneratorTarget->GetManifests(manifest_srcs, this->GetConfigName());
  for (cmSourceFile const* manifest_src : manifest_srcs) {
    depends.push_back(manifest_src->GetFullPath());
  }

  // Add user-specified dependencies.
  this->GeneratorTarget->GetLinkDepends(depends, this->GetConfigName(),
                                        linkLanguage);
}